

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.h
# Opt level: O0

void av1_set_subpel_mv_search_range
               (SubpelMvLimits *subpel_limits,FullMvLimits *mv_limits,MV *ref_mv)

{
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int maxr;
  int minr;
  int maxc;
  int minc;
  int max_mv;
  MV *ref_mv_local;
  FullMvLimits *mv_limits_local;
  SubpelMvLimits *subpel_limits_local;
  
  if (ref_mv->col + -0x1ff8 < mv_limits->col_min * 8) {
    local_30 = mv_limits->col_min << 3;
  }
  else {
    local_30 = ref_mv->col + -0x1ff8;
  }
  if (mv_limits->col_max * 8 < ref_mv->col + 0x1ff8) {
    local_34 = mv_limits->col_max << 3;
  }
  else {
    local_34 = ref_mv->col + 0x1ff8;
  }
  if (ref_mv->row + -0x1ff8 < mv_limits->row_min * 8) {
    local_38 = mv_limits->row_min << 3;
  }
  else {
    local_38 = ref_mv->row + -0x1ff8;
  }
  if (mv_limits->row_max * 8 < ref_mv->row + 0x1ff8) {
    local_3c = mv_limits->row_max << 3;
  }
  else {
    local_3c = ref_mv->row + 0x1ff8;
  }
  if (local_34 < local_30) {
    local_40 = local_30;
  }
  else {
    local_40 = local_34;
  }
  if (local_3c < local_38) {
    local_44 = local_38;
  }
  else {
    local_44 = local_3c;
  }
  if (local_30 < -0x3fff) {
    local_48 = -0x3fff;
  }
  else {
    local_48 = local_30;
  }
  subpel_limits->col_min = local_48;
  if (local_40 < 0x4000) {
    local_4c = local_40;
  }
  else {
    local_4c = 0x3fff;
  }
  subpel_limits->col_max = local_4c;
  if (local_38 < -0x3fff) {
    local_50 = -0x3fff;
  }
  else {
    local_50 = local_38;
  }
  subpel_limits->row_min = local_50;
  if (local_44 < 0x4000) {
    local_54 = local_44;
  }
  else {
    local_54 = 0x3fff;
  }
  subpel_limits->row_max = local_54;
  return;
}

Assistant:

static inline void av1_set_subpel_mv_search_range(SubpelMvLimits *subpel_limits,
                                                  const FullMvLimits *mv_limits,
                                                  const MV *ref_mv) {
  const int max_mv = GET_MV_SUBPEL(MAX_FULL_PEL_VAL);
  int minc = AOMMAX(GET_MV_SUBPEL(mv_limits->col_min), ref_mv->col - max_mv);
  int maxc = AOMMIN(GET_MV_SUBPEL(mv_limits->col_max), ref_mv->col + max_mv);
  int minr = AOMMAX(GET_MV_SUBPEL(mv_limits->row_min), ref_mv->row - max_mv);
  int maxr = AOMMIN(GET_MV_SUBPEL(mv_limits->row_max), ref_mv->row + max_mv);

  maxc = AOMMAX(minc, maxc);
  maxr = AOMMAX(minr, maxr);

  subpel_limits->col_min = AOMMAX(MV_LOW + 1, minc);
  subpel_limits->col_max = AOMMIN(MV_UPP - 1, maxc);
  subpel_limits->row_min = AOMMAX(MV_LOW + 1, minr);
  subpel_limits->row_max = AOMMIN(MV_UPP - 1, maxr);
}